

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdGetCalculateFeeFundRawTx(void *handle,void *fund_handle,int64_t *fee_amount)

{
  CfdException *pCVar1;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  cfd::Initialize();
  local_50._0_8_ = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"FundRawTxData","");
  cfd::capi::CheckBuffer(fund_handle,(string *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._0_8_ != &local_40) {
    operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
  }
  if (fee_amount != (int64_t *)0x0) {
    if (*(long *)((long)fund_handle + 0x50) != 0) {
      *fee_amount = *(int64_t *)((long)fund_handle + 0x60);
      return 0;
    }
    local_50._0_8_ = "cfdcapi_transaction.cpp";
    local_50._8_4_ = 0xd4f;
    local_40._M_allocated_capacity = 0x621df7;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"target addresses is maximum over."
              );
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = &local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to parameter. target addresses is maximum over.","");
    cfd::core::CfdException::CfdException(pCVar1,kCfdOutOfRangeError,(string *)local_50);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_50._0_8_ = "cfdcapi_transaction.cpp";
  local_50._8_4_ = 0xd46;
  local_40._M_allocated_capacity = 0x621df7;
  cfd::core::logger::log<>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"fee_amount is null.");
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = &local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to parameter. fee_amount is null.","");
  cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetCalculateFeeFundRawTx(
    void* handle, void* fund_handle, int64_t* fee_amount) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (fee_amount == nullptr) {
      warn(CFD_LOG_SOURCE, "fee_amount is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fee_amount is null.");
    }

    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);
    if (buffer->append_txout_addresses == nullptr) {
      warn(CFD_LOG_SOURCE, "target addresses is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. target addresses is maximum over.");
    }

    *fee_amount = buffer->calculate_fee;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}